

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

bool __thiscall simdjson::dom::object::iterator::key_equals(iterator *this,string_view o)

{
  uint32_t uVar1;
  int iVar2;
  size_type sVar3;
  const_pointer __s1;
  char *__s2;
  uint32_t len;
  iterator *this_local;
  string_view o_local;
  
  o_local._M_len = (size_t)o._M_str;
  this_local = (iterator *)o._M_len;
  uVar1 = key_length(this);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar3 == uVar1) {
    __s1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __s2 = key_c_str(this);
    iVar2 = memcmp(__s1,__s2,(ulong)uVar1);
    o_local._M_str._7_1_ = iVar2 == 0;
  }
  else {
    o_local._M_str._7_1_ = false;
  }
  return o_local._M_str._7_1_;
}

Assistant:

inline bool object::iterator::key_equals(std::string_view o) const noexcept {
  // We use the fact that the key length can be computed quickly
  // without access to the string buffer.
  const uint32_t len = key_length();
  if(o.size() == len) {
    // We avoid construction of a temporary string_view instance.
    return (memcmp(o.data(), key_c_str(), len) == 0);
  }
  return false;
}